

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_encryption.cc
# Opt level: O0

string * compute_O_value(string *__return_storage_ptr__,string *user_password,string *owner_password
                        ,EncryptionData *data)

{
  int key_len;
  int iVar1;
  size_t max_len;
  uchar *data_00;
  int iterations;
  allocator local_91;
  int local_90 [5];
  allocator local_79;
  undefined1 local_78 [8];
  string k1;
  char upass [32];
  uchar O_key [16];
  EncryptionData *data_local;
  string *owner_password_local;
  string *user_password_local;
  
  compute_O_rc4_key(user_password,owner_password,data,(uchar *)(upass + 0x18));
  pad_or_truncate_password_V4(user_password,k1.field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_78,upass + 0x18,0x10,&local_79);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  local_90[0] = QPDF::EncryptionData::getLengthBytes(data);
  max_len = QIntC::to_size<int>(local_90);
  pad_short_parameter((string *)local_78,max_len);
  data_00 = QUtil::unsigned_char_pointer(k1.field_2._M_local_buf + 8);
  key_len = QPDF::EncryptionData::getLengthBytes(data);
  iVar1 = QPDF::EncryptionData::getR(data);
  iterations = 1;
  if (2 < iVar1) {
    iterations = 0x14;
  }
  iterate_rc4(data_00,0x20,(uchar *)(upass + 0x18),key_len,iterations,false);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,k1.field_2._M_local_buf + 8,0x20,&local_91);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  std::__cxx11::string::~string((string *)local_78);
  return __return_storage_ptr__;
}

Assistant:

static std::string
compute_O_value(
    std::string const& user_password,
    std::string const& owner_password,
    QPDF::EncryptionData const& data)
{
    // Algorithm 3.3 from the PDF 1.7 Reference Manual

    unsigned char O_key[OU_key_bytes_V4];
    compute_O_rc4_key(user_password, owner_password, data, O_key);

    char upass[key_bytes];
    pad_or_truncate_password_V4(user_password, upass);
    std::string k1(reinterpret_cast<char*>(O_key), OU_key_bytes_V4);
    pad_short_parameter(k1, QIntC::to_size(data.getLengthBytes()));
    iterate_rc4(
        QUtil::unsigned_char_pointer(upass),
        key_bytes,
        O_key,
        data.getLengthBytes(),
        (data.getR() >= 3) ? 20 : 1,
        false);
    return {upass, key_bytes};
}